

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O2

idx_t __thiscall duckdb::StructColumnReader::GroupRowsAvailable(StructColumnReader *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  idx_t i;
  size_type __n;
  
  for (__n = 0; __n < (ulong)((long)(this->child_readers).
                                    super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->child_readers).
                                    super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
             ::get<true>(&this->child_readers,__n);
    pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
             operator->(pvVar3);
    bVar1 = TypeHasExactRowCount(&pCVar4->column_schema->type);
    if (bVar1) goto LAB_00371cab;
  }
  __n = 0;
LAB_00371cab:
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
           ::get<true>(&this->child_readers,__n);
  pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(pvVar3);
  iVar2 = (*pCVar4->_vptr_ColumnReader[9])(pCVar4);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

idx_t StructColumnReader::GroupRowsAvailable() {
	for (idx_t i = 0; i < child_readers.size(); i++) {
		if (TypeHasExactRowCount(child_readers[i]->Type())) {
			return child_readers[i]->GroupRowsAvailable();
		}
	}
	return child_readers[0]->GroupRowsAvailable();
}